

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O0

void __thiscall
lzham::lzcompressor::state::get_full_match_costs
          (state *this,CLZBase *lzbase,uint dict_pos,bit_cost_t *pBitcosts,uint match_dist,
          int min_len,int max_len,uint is_match_model_index)

{
  quasi_adaptive_huffman_data_model *pqVar1;
  uint bits;
  uint uVar2;
  bit_cost_t bVar3;
  long in_RCX;
  CLZBase *in_RSI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  int in_stack_00000008;
  uint in_stack_00000010;
  uint main_sym;
  uint match_low_sym;
  bit_cost_t len_cost;
  int match_len;
  quasi_adaptive_huffman_data_model *large_len_table;
  uint match_high_sym;
  uint num_extra_bits;
  uint match_extra;
  uint match_slot;
  bit_cost_t cost;
  quasi_adaptive_huffman_data_model *in_stack_ffffffffffffff88;
  uint sym;
  quasi_adaptive_huffman_data_model *in_stack_ffffffffffffff90;
  quasi_adaptive_huffman_data_model *local_58;
  uint local_4c;
  uint local_38;
  uint local_34;
  quasi_adaptive_huffman_data_model *local_30;
  uint local_28;
  uint local_24;
  long local_20;
  CLZBase *local_10;
  
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_30 = (quasi_adaptive_huffman_data_model *)
             adaptive_bit_model::get_cost
                       ((adaptive_bit_model *)(in_RDI + 0x24 + (ulong)in_stack_00000010 * 2),1);
  bVar3 = adaptive_bit_model::get_cost
                    ((adaptive_bit_model *)(in_RDI + 0x3c + (ulong)*(uint *)(in_RDI + 4) * 2),0);
  local_30 = (quasi_adaptive_huffman_data_model *)(bVar3 + (long)local_30);
  CLZBase::compute_lzx_position_slot(local_10,local_24,&local_34,&local_38);
  bits = (uint)*(byte *)((long)&CLZDecompBase::m_lzx_position_extra_bits + (ulong)local_34);
  if (bits < 3) {
    bVar3 = convert_to_scaled_bitcost(bits);
    local_30 = (quasi_adaptive_huffman_data_model *)(bVar3 + (long)local_30);
  }
  else {
    if (4 < bits) {
      bVar3 = convert_to_scaled_bitcost(bits - 4);
      local_30 = (quasi_adaptive_huffman_data_model *)(bVar3 + (long)local_30);
    }
    bVar3 = quasi_adaptive_huffman_data_model::get_cost
                      (in_stack_ffffffffffffff90,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    local_30 = (quasi_adaptive_huffman_data_model *)(bVar3 + (long)local_30);
  }
  for (local_4c = local_28; pqVar1 = local_30, (int)local_4c <= in_stack_00000008;
      local_4c = local_4c + 1) {
    local_58 = local_30;
    if (8 < (int)local_4c) {
      sym = (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      if ((int)local_4c < 0x102) {
        local_58 = (quasi_adaptive_huffman_data_model *)
                   quasi_adaptive_huffman_data_model::get_cost(in_stack_ffffffffffffff90,sym);
      }
      else {
        uVar2 = get_huge_match_code_len(local_4c);
        in_stack_ffffffffffffff90 = (quasi_adaptive_huffman_data_model *)(ulong)uVar2;
        bVar3 = quasi_adaptive_huffman_data_model::get_cost(in_stack_ffffffffffffff90,sym);
        local_58 = in_stack_ffffffffffffff90 + bVar3;
      }
      local_58 = local_58 + (long)pqVar1;
    }
    bVar3 = quasi_adaptive_huffman_data_model::get_cost
                      (in_stack_ffffffffffffff90,(uint)((ulong)local_58 >> 0x20));
    *(quasi_adaptive_huffman_data_model **)(local_20 + (long)(int)local_4c * 8) = local_58 + bVar3;
    in_stack_ffffffffffffff88 = local_58;
  }
  return;
}

Assistant:

void lzcompressor::state::get_full_match_costs(CLZBase& lzbase, uint dict_pos, bit_cost_t *pBitcosts, uint match_dist, int min_len, int max_len, uint is_match_model_index) const
   {
      LZHAM_NOTE_UNUSED(dict_pos);
      LZHAM_ASSERT(min_len >= CLZBase::cMinMatchLen);

      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(1);

      cost += m_is_rep_model[m_cur_state].get_cost(0);

      uint match_slot, match_extra;
      lzbase.compute_lzx_position_slot(match_dist, match_slot, match_extra);
      LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));

      uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];

      if (num_extra_bits < 3)
         cost += convert_to_scaled_bitcost(num_extra_bits);
      else
      {
         if (num_extra_bits > 4)
            cost += convert_to_scaled_bitcost(num_extra_bits - 4);

         cost += m_dist_lsb_table.get_cost(match_extra & 15);
      }

      uint match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

      const quasi_adaptive_huffman_data_model &large_len_table = m_large_len_table[m_cur_state >= CLZBase::cNumLitStates];

      for (int match_len = min_len; match_len <= max_len; match_len++)
      {
         bit_cost_t len_cost = cost;

         uint match_low_sym = 0;
         if (match_len >= 9)
         {
            match_low_sym = 7;
            if (match_len > CLZBase::cMaxMatchLen)
            {
               len_cost += get_huge_match_code_len(match_len) + large_len_table.get_cost((CLZBase::cMaxMatchLen + 1) - 9);
            }
            else
            {
               len_cost += large_len_table.get_cost(match_len - 9);
            }
         }
         else
            match_low_sym = match_len - 2;

         uint main_sym = match_low_sym | (match_high_sym << 3);

         pBitcosts[match_len] = len_cost + m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);
      }
   }